

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O3

void ccopy(int n,complex<float> *cx,int incx,complex<float> *cy,int incy)

{
  complex<float> *pcVar1;
  complex<float> *pcVar2;
  ulong uVar3;
  
  if (0 < n) {
    if (incy != 1 || incx != 1) {
      pcVar2 = cx + (incx >> 0x1f & (1 - n) * incx);
      pcVar1 = cy + (incy >> 0x1f & (1 - n) * incy);
      do {
        pcVar1->_M_value = pcVar2->_M_value;
        pcVar2 = pcVar2 + incx;
        pcVar1 = pcVar1 + incy;
        n = n + -1;
      } while (n != 0);
      return;
    }
    uVar3 = 0;
    do {
      cy[uVar3]._M_value = cx[uVar3]._M_value;
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  return;
}

Assistant:

void ccopy ( int n, complex <float> cx[], int incx, complex <float> cy[],
  int incy )

//****************************************************************************80
//
//  Purpose:
//
//    CCOPY copies a vector X to a vector Y.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of elements in CX and CY.
//
//    Input, complex <float> CX[], the first vector.
//
//    Input, int INCX, the increment between successive entries of CX.
//
//    Output, complex <float> CY[], the second vector.
//
//    Input, int INCY, the increment between successive entries of CY.
//
{
  int i;
  int ix;
  int iy;

  if ( n <= 0 )
  {
    return;
  }

  if ( incx != 1 || incy != 1 )
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      cy[iy] = cx[ix];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      cy[i] = cx[i];
    }
  }
  return;
}